

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam_mono.cpp
# Opt level: O1

void InitRectifyMap(Mat *K,Mat *D,Mat *Knew,double xi,Size *size,RectMode mode,Mat *map1,Mat *map2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double *pdVar11;
  long lVar12;
  double dVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  Mat Ki;
  double local_608;
  double local_5f8;
  int local_560;
  int local_55c;
  int local_558;
  int local_554;
  Mat local_550 [96];
  Mat local_4f0 [16];
  long local_4e0;
  long *local_4a8;
  Mat local_490 [16];
  long local_480;
  long *local_448;
  Mat local_430 [16];
  long local_420;
  long *local_3e8;
  Mat local_3d0 [16];
  long local_3c0;
  long *local_388;
  Mat local_370 [16];
  long local_360;
  long *local_328;
  Mat local_310 [16];
  double *local_300;
  Mat local_2b0 [16];
  double *local_2a0;
  Mat local_250 [16];
  double *local_240;
  Mat local_1f0 [16];
  double *local_1e0;
  long *local_190 [2];
  Mat local_180 [96];
  Mat local_120 [96];
  Mat local_c0 [144];
  
  local_558 = size->width;
  local_554 = size->height;
  cv::Mat::create(map1,&local_558,5);
  local_560 = size->width;
  local_55c = size->height;
  cv::Mat::create(map2,&local_560,5);
  pdVar11 = *(double **)(K + 0x10);
  dVar1 = *pdVar11;
  dVar2 = pdVar11[1];
  dVar3 = *(double *)((long)pdVar11 + **(long **)(K + 0x48) + 8);
  dVar4 = *(double *)((long)pdVar11 + **(long **)(K + 0x48) + 0x10);
  dVar5 = pdVar11[2];
  pdVar11 = *(double **)(D + 0x10);
  dVar6 = *pdVar11;
  dVar7 = pdVar11[1];
  dVar8 = pdVar11[2];
  dVar9 = pdVar11[3];
  cv::Mat::inv((int)local_190);
  cv::Mat::Mat(local_550);
  (**(code **)(*local_190[0] + 0x18))(local_190[0],local_190,local_550,0xffffffff);
  cv::Mat::~Mat(local_c0);
  cv::Mat::~Mat(local_120);
  cv::Mat::~Mat(local_180);
  if (0 < size->height) {
    lVar14 = 0;
    do {
      if (0 < size->width) {
        dVar13 = (double)(int)lVar14;
        lVar16 = 0;
        do {
          dVar18 = 0.0;
          local_608 = 0.0;
          local_5f8 = 0.0;
          iVar15 = (int)lVar16;
          if (mode == RECT_PERSPECTIVE) {
            cv::Mat::Mat(local_310,local_550);
            dVar21 = (double)iVar15;
            local_5f8 = *local_300 * dVar21 + local_300[1] * dVar13 + local_300[2];
            cv::Mat::~Mat(local_310);
            cv::Mat::Mat(local_490,local_550);
            lVar12 = *local_448;
            dVar18 = *(double *)(local_480 + lVar12);
            dVar10 = *(double *)(local_480 + 8 + lVar12);
            local_608 = *(double *)(local_480 + 0x10 + lVar12);
            cv::Mat::~Mat(local_490);
            cv::Mat::Mat(local_4f0,local_550);
            local_608 = local_608 + dVar18 * dVar21 + dVar10 * dVar13;
            lVar12 = *local_4a8;
            dVar18 = dVar21 * *(double *)(local_4e0 + lVar12 * 2) +
                     *(double *)(local_4e0 + 8 + lVar12 * 2) * dVar13 +
                     *(double *)(local_4e0 + 0x10 + lVar12 * 2);
            cv::Mat::~Mat(local_4f0);
          }
          if (mode == RECT_CYLINDRICAL) {
            cv::Mat::Mat(local_1f0,local_550);
            dVar18 = *local_1e0;
            dVar10 = local_1e0[1];
            dVar21 = local_1e0[2];
            cv::Mat::~Mat(local_1f0);
            cv::Mat::Mat(local_370,local_550);
            dVar21 = dVar21 + dVar18 * (double)iVar15 + dVar10 * dVar13;
            lVar12 = *local_328;
            dVar10 = (double)iVar15 * *(double *)(local_360 + lVar12) +
                     *(double *)(local_360 + 8 + lVar12) * dVar13 +
                     *(double *)(local_360 + 0x10 + lVar12) + 0.2617993877991494;
            cv::Mat::~Mat(local_370);
            dVar18 = sin(dVar10);
            local_5f8 = cos(dVar21);
            local_5f8 = local_5f8 * -dVar18;
            local_608 = cos(dVar10);
            local_608 = -local_608;
            dVar10 = sin(dVar10);
            dVar18 = sin(dVar21);
            dVar18 = dVar18 * dVar10;
          }
          if (mode == RECT_FISHEYE) {
            dVar18 = (double)iVar15;
            dVar10 = hypot(dVar18 - *(double *)(*(long *)(Knew + 0x10) + 0x10),
                           dVar13 - *(double *)
                                     (*(long *)(Knew + 0x10) + 0x10 + **(long **)(Knew + 0x48)));
            if (dVar10 < **(double **)(Knew + 0x10) || dVar10 == **(double **)(Knew + 0x10)) {
              cv::Mat::Mat(local_250,local_550);
              dVar10 = *local_240;
              dVar21 = local_240[1];
              local_5f8 = local_240[2];
              cv::Mat::~Mat(local_250);
              cv::Mat::Mat(local_3d0,local_550);
              local_5f8 = local_5f8 + dVar10 * dVar18 + dVar21 * dVar13;
              lVar12 = *local_388;
              local_608 = dVar18 * *(double *)(local_3c0 + lVar12) +
                          *(double *)(local_3c0 + 8 + lVar12) * dVar13 +
                          *(double *)(local_3c0 + 0x10 + lVar12);
              cv::Mat::~Mat(local_3d0);
              dVar18 = 2.0 / (local_5f8 * local_5f8 + local_608 * local_608 + 1.0);
              local_5f8 = local_5f8 * dVar18;
              local_608 = local_608 * dVar18;
              dVar18 = dVar18 + -1.0;
              goto LAB_00103f2e;
            }
            *(undefined4 *)(**(long **)(map1 + 0x48) * lVar14 + *(long *)(map1 + 0x10) + lVar16 * 4)
                 = 0xbf800000;
            fVar17 = -1.0;
          }
          else {
LAB_00103f2e:
            if (mode == RECT_LONGLAT) {
              cv::Mat::Mat(local_2b0,local_550);
              dVar18 = *local_2a0;
              dVar10 = local_2a0[1];
              dVar21 = local_2a0[2];
              cv::Mat::~Mat(local_2b0);
              cv::Mat::Mat(local_430,local_550);
              dVar21 = dVar21 + dVar18 * (double)iVar15 + dVar10 * dVar13;
              lVar12 = *local_3e8;
              dVar19 = (double)iVar15 * *(double *)(local_420 + lVar12) +
                       *(double *)(local_420 + 8 + lVar12) * dVar13 +
                       *(double *)(local_420 + 0x10 + lVar12);
              cv::Mat::~Mat(local_430);
              local_5f8 = cos(dVar21);
              local_5f8 = -local_5f8;
              local_608 = sin(dVar21);
              local_608 = -local_608;
              dVar18 = cos(dVar19);
              local_608 = dVar18 * local_608;
              dVar10 = sin(dVar21);
              dVar18 = sin(dVar19);
              dVar18 = dVar18 * dVar10;
            }
            dVar10 = dVar18 * dVar18 + local_5f8 * local_5f8 + local_608 * local_608;
            if (dVar10 < 0.0) {
              dVar10 = sqrt(dVar10);
            }
            else {
              dVar10 = SQRT(dVar10);
            }
            dVar21 = dVar18 / dVar10 + xi;
            dVar20 = (local_5f8 / dVar10) / dVar21;
            dVar21 = (local_608 / dVar10) / dVar21;
            dVar10 = dVar20 * dVar20 + dVar21 * dVar21;
            dVar18 = dVar6 * dVar10 + 1.0 + dVar10 * dVar10 * dVar7;
            dVar19 = ((dVar21 + dVar21) * dVar21 + dVar10) * dVar8 +
                     dVar18 * dVar21 + dVar20 * (dVar9 + dVar9) * dVar21;
            *(float *)(**(long **)(map1 + 0x48) * lVar14 + *(long *)(map1 + 0x10) + lVar16 * 4) =
                 (float)(dVar2 * dVar19 +
                         (((dVar20 + dVar20) * dVar20 + dVar10) * dVar9 +
                         dVar18 * dVar20 + (dVar8 + dVar8) * dVar20 * dVar21) * dVar1 + dVar5);
            fVar17 = (float)(dVar19 * dVar3 + dVar4);
          }
          *(float *)(**(long **)(map2 + 0x48) * lVar14 + *(long *)(map2 + 0x10) + lVar16 * 4) =
               fVar17;
          lVar16 = lVar16 + 1;
        } while (lVar16 < size->width);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < size->height);
  }
  cv::Mat::~Mat(local_550);
  return;
}

Assistant:

void InitRectifyMap(cv::Mat K,
                    cv::Mat D,
                    cv::Mat Knew,
                    double xi,
                    cv::Size size,
                    RectMode mode,
                    cv::Mat& map1,
                    cv::Mat& map2) {
  map1.create(size, CV_32F);
  map2.create(size, CV_32F);

  double fx = K.at<double>(0,0);
  double fy = K.at<double>(1,1);
  double cx = K.at<double>(0,2);
  double cy = K.at<double>(1,2);
  double s  = K.at<double>(0,1);

  double k1 = D.at<double>(0,0);
  double k2 = D.at<double>(0,1);
  double p1 = D.at<double>(0,2);
  double p2 = D.at<double>(0,3);

  cv::Mat Ki  = Knew.inv();

  for (int r = 0; r < size.height; ++r) {
    for (int c = 0; c < size.width; ++c) {
      double xc = 0.;
      double yc = 0.;
      double zc = 0.;

      if (mode == RECT_PERSPECTIVE) {
        xc = MatRowMul(Ki, c, r, 1., 0);
        yc = MatRowMul(Ki, c, r, 1., 1);
        zc = MatRowMul(Ki, c, r, 1., 2);
      }

      if (mode == RECT_CYLINDRICAL) {
        double tt = MatRowMul(Ki, c, r, 1., 0);
        double pp = MatRowMul(Ki, c, r, 1., 1) + MARGIN;

        xc = -sin(pp) * cos(tt);
        yc = -cos(pp);
        zc =  sin(pp) * sin(tt);
      }

      if (mode == RECT_FISHEYE) {
        if (hypot(c - Knew.at<double>(0, 2), r - Knew.at<double>(1, 2))
            > Knew.at<double>(0, 0)) {
          map1.at<float>(r,c) = -1.f;
          map2.at<float>(r,c) = -1.f;
          continue;
        }
        double ee = MatRowMul(Ki, c, r, 1., 0);
        double ff = MatRowMul(Ki, c, r, 1., 1);

        double zz = 2. / (ee * ee + ff * ff + 1.);

        xc = zz * ee;
        yc = zz * ff;
        zc = zz - 1.;
      }

      if (mode == RECT_LONGLAT) {
        double tt = MatRowMul(Ki, c, r, 1., 0);
        double pp = MatRowMul(Ki, c, r, 1., 1);

        xc = -cos(tt);
        yc = -sin(tt) * cos(pp);
        zc =  sin(tt) * sin(pp);
      }

      double rr = sqrt(xc * xc + yc * yc + zc * zc);
      double xs = xc / rr;
      double ys = yc / rr;
      double zs = zc / rr;

      double xu = xs / (zs + xi);
      double yu = ys / (zs + xi);

      double r2 = xu * xu + yu * yu;
      double r4 = r2 * r2;
      double xd = (1+k1*r2+k2*r4)*xu + 2*p1*xu*yu + p2*(r2+2*xu*xu);
      double yd = (1+k1*r2+k2*r4)*yu + 2*p2*xu*yu + p1*(r2+2*yu*yu);

      double u = fx * xd + s * yd + cx;
      double v = fy * yd + cy;

      map1.at<float>(r,c) = (float) u;
      map2.at<float>(r,c) = (float) v;
    }
  }
}